

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<ImGuiTextFilter::ImGuiTextRange>::resize
          (ImVector<ImGuiTextFilter::ImGuiTextRange> *this,int new_size,ImGuiTextRange *v)

{
  undefined8 *puVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = this->Capacity;
  if (iVar5 < new_size) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= new_size) {
      iVar5 = new_size;
    }
    reserve(this,iVar5);
  }
  lVar3 = (long)this->Size;
  if (this->Size < new_size) {
    lVar4 = lVar3 << 4;
    for (; lVar3 < new_size; lVar3 = lVar3 + 1) {
      pcVar2 = v->e;
      puVar1 = (undefined8 *)((long)&this->Data->b + lVar4);
      *puVar1 = v->b;
      puVar1[1] = pcVar2;
      lVar4 = lVar4 + 0x10;
    }
  }
  this->Size = new_size;
  return;
}

Assistant:

inline void         resize(int new_size, const T& v)    { if (new_size > Capacity) reserve(_grow_capacity(new_size)); if (new_size > Size) for (int n = Size; n < new_size; n++) memcpy(&Data[n], &v, sizeof(v)); Size = new_size; }